

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

void google::protobuf::internal::SizedArrayDelete(void *p,size_t size)

{
  size_t size_local;
  void *p_local;
  
  operator_delete__(p,size);
  return;
}

Assistant:

inline void SizedArrayDelete(void* p, size_t size) {
#if defined(__cpp_sized_deallocation)
  ::operator delete[](p, size);
#else
  // Avoid -Wunused-parameter
  (void)size;
  ::operator delete[](p);
#endif
}